

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

void fill_window(deflate_state *s)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  Posf local_40;
  Posf local_3c;
  ulong local_38;
  ulg init;
  ulg curr;
  uInt wsize;
  uint more;
  Posf *p;
  uint m;
  uint n;
  deflate_state *s_local;
  
  uVar1 = s->w_size;
  while( true ) {
    curr._4_4_ = ((int)s->window_size - s->lookahead) - s->strstart;
    if (uVar1 + (s->w_size - 0x106) <= s->strstart) {
      memcpy(s->window,s->window + uVar1,(ulong)uVar1);
      s->match_start = s->match_start - uVar1;
      s->strstart = s->strstart - uVar1;
      s->block_start = s->block_start - (ulong)uVar1;
      p._4_4_ = s->hash_size;
      _wsize = s->head + p._4_4_;
      do {
        if (_wsize[-1] < uVar1) {
          local_3c = 0;
        }
        else {
          local_3c = _wsize[-1] - (short)uVar1;
        }
        _wsize[-1] = local_3c;
        p._4_4_ = p._4_4_ - 1;
        _wsize = _wsize + -1;
      } while (p._4_4_ != 0);
      _wsize = s->prev + uVar1;
      p._4_4_ = uVar1;
      do {
        if (_wsize[-1] < uVar1) {
          local_40 = 0;
        }
        else {
          local_40 = _wsize[-1] - (short)uVar1;
        }
        _wsize[-1] = local_40;
        p._4_4_ = p._4_4_ - 1;
        _wsize = _wsize + -1;
      } while (p._4_4_ != 0);
      curr._4_4_ = uVar1 + curr._4_4_;
    }
    if (s->strm->avail_in == 0) break;
    iVar2 = read_buf(s->strm,s->window + (ulong)s->lookahead + (ulong)s->strstart,curr._4_4_);
    s->lookahead = iVar2 + s->lookahead;
    if (2 < s->lookahead) {
      s->ins_h = (uint)s->window[s->strstart];
      s->ins_h = (s->ins_h << ((byte)s->hash_shift & 0x1f) ^ (uint)s->window[s->strstart + 1]) &
                 s->hash_mask;
    }
    bVar4 = false;
    if (s->lookahead < 0x106) {
      bVar4 = s->strm->avail_in != 0;
    }
    if (!bVar4) {
      if (s->high_water < s->window_size) {
        uVar3 = (ulong)s->strstart + (ulong)s->lookahead;
        if (s->high_water < uVar3) {
          local_38 = s->window_size - uVar3;
          if (0x102 < local_38) {
            local_38 = 0x102;
          }
          memset(s->window + uVar3,0,local_38 & 0xffffffff);
          s->high_water = uVar3 + local_38;
        }
        else if (s->high_water < uVar3 + 0x102) {
          local_38 = (uVar3 + 0x102) - s->high_water;
          if (s->window_size - s->high_water < local_38) {
            local_38 = s->window_size - s->high_water;
          }
          memset(s->window + s->high_water,0,local_38 & 0xffffffff);
          s->high_water = local_38 + s->high_water;
        }
      }
      return;
    }
  }
  return;
}

Assistant:

local void fill_window(deflate_state *s)
{
    register unsigned n, m;
    register Posf *p;
    unsigned more;    /* Amount of free space at the end of the window. */
    uInt wsize = s->w_size;

    do {
        more = (unsigned)(s->window_size -(ulg)s->lookahead -(ulg)s->strstart);

        /* Deal with !@#$% 64K limit: */
        if (sizeof(int) <= 2) {
            if (more == 0 && s->strstart == 0 && s->lookahead == 0) {
                more = wsize;

            } else if (more == (unsigned)(-1)) {
                /* Very unlikely, but possible on 16 bit machine if
                 * strstart == 0 && lookahead == 1 (input done a byte at time)
                 */
                more--;
            }
        }

        /* If the window is almost full and there is insufficient lookahead,
         * move the upper half to the lower one to make room in the upper half.
         */
        if (s->strstart >= wsize+MAX_DIST(s)) {

            zmemcpy(s->window, s->window+wsize, (unsigned)wsize);
            s->match_start -= wsize;
            s->strstart    -= wsize; /* we now have strstart >= MAX_DIST */
            s->block_start -= (long) wsize;

            /* Slide the hash table (could be avoided with 32 bit values
               at the expense of memory usage). We slide even when level == 0
               to keep the hash table consistent if we switch back to level > 0
               later. (Using level 0 permanently is not an optimal usage of
               zlib, so we don't care about this pathological case.)
             */
            n = s->hash_size;
            p = &s->head[n];
            do {
                m = *--p;
                *p = (Pos)(m >= wsize ? m-wsize : NIL);
            } while (--n);

            n = wsize;
#ifndef FASTEST
            p = &s->prev[n];
            do {
                m = *--p;
                *p = (Pos)(m >= wsize ? m-wsize : NIL);
                /* If n is not on any hash chain, prev[n] is garbage but
                 * its value will never be used.
                 */
            } while (--n);
#endif
            more += wsize;
        }
        if (s->strm->avail_in == 0) return;

        /* If there was no sliding:
         *    strstart <= WSIZE+MAX_DIST-1 && lookahead <= MIN_LOOKAHEAD - 1 &&
         *    more == window_size - lookahead - strstart
         * => more >= window_size - (MIN_LOOKAHEAD-1 + WSIZE + MAX_DIST-1)
         * => more >= window_size - 2*WSIZE + 2
         * In the BIG_MEM or MMAP case (not yet supported),
         *   window_size == input_size + MIN_LOOKAHEAD  &&
         *   strstart + s->lookahead <= input_size => more >= MIN_LOOKAHEAD.
         * Otherwise, window_size == 2*WSIZE so more >= 2.
         * If there was sliding, more >= WSIZE. So in all cases, more >= 2.
         */
        Assert(more >= 2, "more < 2");

        n = read_buf(s->strm, s->window + s->strstart + s->lookahead, more);
        s->lookahead += n;

        /* Initialize the hash value now that we have some input: */
        if (s->lookahead >= MIN_MATCH) {
            s->ins_h = s->window[s->strstart];
            UPDATE_HASH(s, s->ins_h, s->window[s->strstart+1]);
#if MIN_MATCH != 3
            Call UPDATE_HASH() MIN_MATCH-3 more times
#endif
        }
        /* If the whole input has less than MIN_MATCH bytes, ins_h is garbage,
         * but this is not important since only literal bytes will be emitted.
         */

    } while (s->lookahead < MIN_LOOKAHEAD && s->strm->avail_in != 0);

    /* If the WIN_INIT bytes after the end of the current data have never been
     * written, then zero those bytes in order to avoid memory check reports of
     * the use of uninitialized (or uninitialised as Julian writes) bytes by
     * the longest match routines.  Update the high water mark for the next
     * time through here.  WIN_INIT is set to MAX_MATCH since the longest match
     * routines allow scanning to strstart + MAX_MATCH, ignoring lookahead.
     */
    if (s->high_water < s->window_size) {
        ulg curr = s->strstart + (ulg)(s->lookahead);
        ulg init;

        if (s->high_water < curr) {
            /* Previous high water mark below current data -- zero WIN_INIT
             * bytes or up to end of window, whichever is less.
             */
            init = s->window_size - curr;
            if (init > WIN_INIT)
                init = WIN_INIT;
            zmemzero(s->window + curr, (unsigned)init);
            s->high_water = curr + init;
        }
        else if (s->high_water < (ulg)curr + WIN_INIT) {
            /* High water mark at or above current data, but below current data
             * plus WIN_INIT -- zero out to current data plus WIN_INIT, or up
             * to end of window, whichever is less.
             */
            init = (ulg)curr + WIN_INIT - s->high_water;
            if (init > s->window_size - s->high_water)
                init = s->window_size - s->high_water;
            zmemzero(s->window + s->high_water, (unsigned)init);
            s->high_water += init;
        }
    }
}